

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O3

void vkt::pipeline::anon_unknown_0::addSimpleVertexAndFragmentPrograms
               (SourceCollections *programCollection,CaseDef *caseDef)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  TextureFormat TVar5;
  char *pcVar6;
  size_t sVar7;
  ProgramSources *pPVar8;
  ostream *poVar9;
  char *pcVar10;
  string colorFormat;
  ostringstream src;
  undefined1 auStack_238 [8];
  string local_230;
  uint local_210;
  value_type local_208;
  string local_1e8;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  TVar5 = ::vk::mapVkFormat(caseDef->colorFormat);
  iVar4 = tcu::getNumUsedChannels(TVar5.order);
  bVar2 = ::vk::isUintFormat(caseDef->colorFormat);
  bVar3 = ::vk::isIntFormat(caseDef->colorFormat);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar6 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x90);
  }
  else {
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in  vec4 in_position;\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 1) in  vec4 in_color;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out vec4 o_color;\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"out gl_PerVertex {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    vec4 gl_Position;\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"};\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    gl_Position = in_position;\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"    o_color     = in_color;\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"vert","");
  pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_230);
  std::__cxx11::stringbuf::str();
  local_210 = 0;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_1e8._M_dataplus._M_p,
             local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar8->sources + local_210,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_1e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (iVar4 == 1) {
    pcVar6 = "float";
    if (bVar3) {
      pcVar6 = "int";
    }
    pcVar10 = "uint";
    if (!bVar2) {
      pcVar10 = pcVar6;
    }
    sVar7 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar7);
  }
  else {
    pcVar6 = "";
    if (bVar3) {
      pcVar6 = "i";
    }
    pcVar10 = "u";
    if (!bVar2) {
      pcVar10 = pcVar6;
    }
    sVar7 = strlen(pcVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vec",3);
    std::ostream::operator<<(local_1a8,iVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar6 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)auStack_238 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x90);
  }
  else {
    sVar7 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) in  vec4 in_color;\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out ",0x19);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," o_color;\n",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"void main(void)\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"    o_color = ",0xe);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(",1);
  if (iVar4 == 1) {
    pcVar6 = "in_color.r";
  }
  else if (iVar4 == 2) {
    pcVar6 = "in_color.rg";
  }
  else {
    pcVar6 = "in_color";
    if (iVar4 == 3) {
      pcVar6 = "in_color.rgb";
    }
  }
  sVar7 = strlen(pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar6,sVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,");\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}\n",2);
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"frag","");
  pPVar8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1e8);
  std::__cxx11::stringbuf::str();
  local_210 = 1;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_1c8,local_1c0 + (long)local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar8->sources + local_210,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void addSimpleVertexAndFragmentPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	const int	numComponents	= tcu::getNumUsedChannels(mapVkFormat(caseDef.colorFormat).order);
	const bool	isUint			= isUintFormat(caseDef.colorFormat);
	const bool	isSint			= isIntFormat(caseDef.colorFormat);

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_position;\n"
			<< "layout(location = 1) in  vec4 in_color;\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< "\n"
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    gl_Position = in_position;\n"
			<< "    o_color     = in_color;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		const std::string colorFormat = getColorFormatStr(numComponents, isUint, isSint);

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) in  vec4 in_color;\n"
			<< "layout(location = 0) out " << colorFormat << " o_color;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    o_color = " << colorFormat << "("		// float color will be converted to int/uint here if needed
			<< (numComponents == 1 ? "in_color.r"   :
				numComponents == 2 ? "in_color.rg"  :
				numComponents == 3 ? "in_color.rgb" : "in_color") << ");\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}